

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTRealTraffic.cpp
# Opt level: O0

time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
 __thiscall RealTrafficConnection::SetRequType(RealTrafficConnection *this,positionTy *_pos)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  bool bVar8;
  SimTimeCtrlTy SVar9;
  int iVar10;
  uint uVar11;
  longlong lVar12;
  time_t tVar13;
  ulong uVar14;
  duration dVar15;
  long lVar16;
  double *pdVar17;
  double *in_RSI;
  positionTy *in_RDI;
  positionTy *this_00;
  float fVar18;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  positionTy posUser;
  time_t now;
  time_t simNow;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 uVar19;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff60;
  double in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff80;
  double *in_stack_ffffffffffffff88;
  DataRefs *in_stack_ffffffffffffff90;
  duration local_8;
  
  in_RDI[9]._lat = in_RSI[8];
  dVar1 = *in_RSI;
  dVar2 = in_RSI[1];
  dVar3 = in_RSI[2];
  dVar4 = in_RSI[3];
  dVar5 = in_RSI[4];
  dVar6 = in_RSI[5];
  dVar7 = in_RSI[7];
  *(double *)&in_RDI[8].mergeCount = in_RSI[6];
  in_RDI[8].edgeIdx = (size_t)dVar7;
  in_RDI[8]._pitch = dVar5;
  in_RDI[8]._roll = dVar6;
  in_RDI[8]._ts = dVar3;
  in_RDI[8]._head = dVar4;
  in_RDI[8]._lon = dVar1;
  in_RDI[8]._alt = dVar2;
  in_RDI[9]._lon = 0.0;
  SVar9 = DataRefs::GetRTSTC(&dataRefs);
  if (SVar9 == STC_NO_CTRL) {
    in_RDI[9]._lon = 0.0;
  }
  else if (SVar9 == STC_SIM_TIME_MANUALLY) {
    iVar10 = DataRefs::GetRTManTOfs(&dataRefs);
    in_RDI[9]._lon = (double)(long)iVar10;
  }
  else if (SVar9 == STC_SIM_TIME_PLUS_BUFFER) {
    bVar8 = DataRefs::IsUsingSystemTime((DataRefs *)0x21d0c1);
    if (bVar8) {
      in_RDI[9]._lon = 0.0;
    }
    else {
      lVar12 = DataRefs::GetXPSimTime_ms(&dataRefs);
      tVar13 = time((time_t *)0x0);
      in_stack_ffffffffffffff70 = (double)(tVar13 - lVar12 / 1000);
      iVar10 = DataRefs::GetFdBufPeriod(&dataRefs);
      in_RDI[9]._lon = (double)(((long)in_stack_ffffffffffffff70 - (long)iVar10) / 0x3c);
      if ((long)in_RDI[9]._lon < 0) {
        in_RDI[9]._lon = 0.0;
      }
    }
  }
  uVar14 = (**(code **)((long)in_RDI->_lat + 0x20))();
  if ((uVar14 & 1) == 0) {
    *(undefined4 *)&in_RDI[7]._pitch = 2;
    dVar15.__r = std::chrono::_V2::steady_clock::now();
    return (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            )(duration)dVar15.__r;
  }
  uVar14 = std::__cxx11::string::empty();
  if ((uVar14 & 1) != 0) {
    *(undefined4 *)&in_RDI[7]._pitch = 1;
    dVar15.__r = std::chrono::_V2::steady_clock::now();
    return (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            )(duration)dVar15.__r;
  }
  if (*(int *)&in_RDI[7]._pitch == 4) {
    *(undefined4 *)&in_RDI[7]._pitch = 5;
    return (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            )(duration)in_RDI[9]._ts;
  }
  DataRefs::GetUsersPlanePos
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             (double *)CONCAT44(SVar9,in_stack_ffffffffffffff80),&in_RDI->_lat);
  if (*(int *)&in_RDI[0xb]._head < 5) {
    uVar11 = std::isnan(in_RDI[9]._head);
    if ((uVar11 & 1) == 0) {
      lVar16 = (long)in_RDI[9]._lon - (long)in_RDI[0xb]._ts;
      if (lVar16 < 1) {
        lVar16 = -lVar16;
      }
      if (lVar16 < 0x79) {
        dVar1 = positionTy::distRoughSqr
                          ((positionTy *)CONCAT44(SVar9,in_stack_ffffffffffffff80),in_RDI);
        fVar18 = DataRefs::GetWeatherMaxMetarDist_m(&dataRefs);
        dVar2 = sqr<double>((double)fVar18 / 2.0);
        if (dVar1 <= dVar2) {
          pdVar17 = positionTy::heading((positionTy *)&in_RDI[9]._roll);
          in_stack_ffffffffffffff60 =
               (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)*pdVar17;
          this_00 = (positionTy *)&stack0xffffffffffffff90;
          positionTy::heading(this_00);
          iVar10 = (int)this_00;
          HeadingDiff((double)in_RDI,in_stack_ffffffffffffff70);
          std::abs(iVar10);
          if ((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) < 45.0 ||
              (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) == 45.0) goto LAB_0021d371;
        }
      }
    }
    *(undefined4 *)&in_RDI[7]._pitch = 4;
    lVar16 = (long)in_RDI[9]._lon - (long)in_RDI[0xb]._ts;
    if (lVar16 < 1) {
      lVar16 = -lVar16;
    }
    if (0x78 < lVar16) {
      in_RDI[9]._head = NAN;
    }
    local_8.__r = (rep)in_RDI[9]._ts;
  }
  else {
LAB_0021d371:
    uVar19 = false;
    if (*(int *)&in_RDI[0xb]._head < 5) {
      std::chrono::_V2::steady_clock::now();
      uVar19 = std::chrono::operator>=
                         (in_stack_ffffffffffffff60,
                          (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           *)CONCAT17(uVar19,in_stack_ffffffffffffff58));
    }
    if ((bool)uVar19 == false) {
      if ((((ulong)in_RDI[0x1a]._ts & 1) == 0) || (bVar8 = LTAptAvailable(), !bVar8)) {
        *(undefined4 *)&in_RDI[7]._pitch = 6;
        local_8.__r = (rep)in_RDI[9]._alt;
      }
      else {
        *(undefined4 *)&in_RDI[7]._pitch = 3;
        local_8.__r = (rep)in_RDI[9]._alt;
      }
    }
    else {
      *(undefined4 *)&in_RDI[7]._pitch = 5;
      local_8.__r = (rep)in_RDI[9]._ts;
    }
  }
  return (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          )(duration)local_8.__r;
}

Assistant:

std::chrono::time_point<std::chrono::steady_clock> RealTrafficConnection::SetRequType (const positionTy& _pos)
{
    // Position as passed in
    curr.pos = _pos;
    
    // Time offset: in minutes compared to now
    curr.tOff = 0L;
    switch (dataRefs.GetRTSTC()) {
        case STC_NO_CTRL:                           // don't send any ofset ever
            curr.tOff = 0L;
            break;
            
        case STC_SIM_TIME_MANUALLY:                 // send what got configured manually
            curr.tOff = dataRefs.GetRTManTOfs();
            break;
            
        case STC_SIM_TIME_PLUS_BUFFER:              // Send as per current simulation time
            if (dataRefs.IsUsingSystemTime()) {     // Using system time means: No ofset
                curr.tOff = 0;
            } else {
                // Simulated 'now' in seconds since the epoch
                const time_t simNow = time_t(dataRefs.GetXPSimTime_ms() / 1000LL);
                const time_t now = time(nullptr);
                // offset between older 'simNow' and current 'now' in minutes, minus buffering period
                curr.tOff = long(now - simNow - dataRefs.GetFdBufPeriod()) / 60L;
                // must be positive
                if (curr.tOff < 0) curr.tOff = 0;
            }
            break;
    }
    
    if (!shallRun()) {                                          // end the session?
        curr.eRequType = CurrTy::RT_REQU_DEAUTH;
        return std::chrono::steady_clock::now();
    }
    if (curr.sGUID.empty()) {                                   // have no GUID? Need authentication
        curr.eRequType = CurrTy::RT_REQU_AUTH;
        return std::chrono::steady_clock::now();
    }
    if (curr.eRequType == CurrTy::RT_REQU_NEAREST_METAR) {      // previous request was METAR location?
        curr.eRequType = CurrTy::RT_REQU_WEATHER;
        return tNextWeather;
    }
    const positionTy posUser = dataRefs.GetUsersPlanePos();     // Where is the user's plane just now=
    if (rtWx.nErr < RT_DRCT_MAX_WX_ERR &&                       // not yet seen too many weather request errors? _AND_
        (std::isnan(rtWx.QNH) ||                                // no Weather, or wrong time offset, or outdated, or moved too far away?
         std::labs(curr.tOff - rtWx.tOff) > 120 ||
         // too far? (we use half the max. METAR distance
         rtWx.pos.distRoughSqr(posUser) > (sqr(dataRefs.GetWeatherMaxMetarDist_m()/2.0)) ||
         // or turned by at least 45 degrees? (Heading into a different direction can mean to select a different METAR)
         std::abs(HeadingDiff(rtWx.pos.heading(), posUser.heading())) > 45.0))
    {
        curr.eRequType = CurrTy::RT_REQU_NEAREST_METAR;
        if (std::labs(curr.tOff - rtWx.tOff) > 120)             // if changing the timeoffset (request other historic data) then we must have new weather before proceeding
            rtWx.QNH = NAN;
        return tNextWeather;
    }
    if (rtWx.nErr < RT_DRCT_MAX_WX_ERR &&                       // not yet seen too many weather request errors? _AND_
        std::chrono::steady_clock::now() >= rtWx.next)          // just time for a weather update
    {
        curr.eRequType = CurrTy::RT_REQU_WEATHER;
        return tNextWeather;
    }
    if (bDoParkedTraffic && LTAptAvailable()) {                 // Do the parked traffic now, and only when airport details are available so we can place the aircraft correctly
        curr.eRequType = CurrTy::RT_REQU_PARKED;
        return tNextTraffic;
    }
    
    // in all other cases we ask for traffic data
    curr.eRequType = CurrTy::RT_REQU_TRAFFIC;
    return tNextTraffic;
}